

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

void __thiscall
gl4cts::GPUShaderFP64Test10::prepareComponents
          (GPUShaderFP64Test10 *this,functionObject *function_object,GLuint vertex,GLuint argument,
          GLubyte *buffer)

{
  GLuint GVar1;
  GLdouble GVar2;
  _variable_type _Var3;
  uint uVar4;
  GLuint GVar5;
  functionEnum fVar6;
  TestError *pTVar7;
  uint local_d4;
  GLuint value_2;
  GLuint component_2;
  GLuint *argument_dst_2;
  GLint value_1;
  GLuint component_1;
  GLint *argument_dst_1;
  GLdouble value;
  GLuint component;
  GLdouble *argument_dst;
  GLuint i;
  GLuint uint_argument_start;
  GLuint n_components;
  GLuint n_arguments;
  GLuint int_argument_start;
  _variable_type base_arg_type;
  GLdouble double_argument_start [3];
  uint local_58 [2];
  GLuint argument_step [3];
  undefined4 uStack_44;
  GLuint argument_reset [3];
  GLuint argument_index [3];
  GLubyte *buffer_local;
  GLuint argument_local;
  GLuint vertex_local;
  functionObject *function_object_local;
  GPUShaderFP64Test10 *this_local;
  
  stack0xffffffffffffffc8 = 0;
  argument_reset[0] = 0;
  stack0xffffffffffffffb8 = 0;
  argument_step[0] = 0;
  _int_argument_start = 0;
  double_argument_start[0] = 0.0;
  double_argument_start[1] = 0.0;
  _Var3 = (*function_object->_vptr_functionObject[4])(function_object,(ulong)argument);
  _Var3 = Utils::getBaseVariableType(_Var3);
  uVar4 = (*function_object->_vptr_functionObject[3])();
  GVar5 = functionObject::getArgumentComponents(function_object,argument);
  if (uVar4 == 1) {
    stack0xffffffffffffffb8 = CONCAT44(uStack_44,0x400);
    _int_argument_start = 0xc07ff80000000000;
  }
  else if (uVar4 == 2) {
    stack0xffffffffffffffb8 = 0x2000000020;
    _int_argument_start = 0xc02f000000000000;
    double_argument_start[0] = -15.5;
  }
  else {
    if (uVar4 != 3) {
      pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar7,"Not implemented",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                 ,0x399b);
      __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    argument_step[0] = 1;
    stack0xffffffffffffffb8 = 0x800000010;
    argument_reset[0] = 8;
    _int_argument_start = 0xc01e000000000000;
    double_argument_start[0] = -3.5;
    double_argument_start[1] = -3.5;
  }
  fVar6 = functionObject::getFunctionEnum(function_object);
  if (fVar6 - FUNCTION_CLAMP < 2) {
    double_argument_start[1] = 4.5;
  }
  else if (fVar6 == FUNCTION_INVERSESQRT) {
    _int_argument_start = 0x4030800000000000;
  }
  else if (fVar6 - FUNCTION_SMOOTHSTEP < 2) {
    argument_step[0] = 0x40;
    stack0xffffffffffffffb8 = 0x800000008;
    argument_reset[0] = 0x10;
    _int_argument_start = 0xc00c000000000000;
    double_argument_start[0] = 4.5;
    double_argument_start[1] = -7.5;
  }
  for (argument_dst._0_4_ = 0; (uint)argument_dst < uVar4;
      argument_dst._0_4_ = (uint)argument_dst + 1) {
    argument_reset[(ulong)(uint)argument_dst + 2] =
         (GLuint)(((ulong)vertex / (ulong)argument_step[(ulong)(uint)argument_dst - 2]) %
                 (ulong)argument_step[(ulong)(uint)argument_dst + 2]);
  }
  if (_Var3 == VARIABLE_TYPE_DOUBLE) {
    *(double *)(&int_argument_start + (ulong)argument * 2) =
         (double)argument_reset[(ulong)argument + 2] +
         *(double *)(&int_argument_start + (ulong)argument * 2);
    for (value._4_4_ = 0; value._4_4_ < GVar5; value._4_4_ = value._4_4_ + 1) {
      argument_dst_1 =
           (GLint *)(*(double *)(&int_argument_start + (ulong)argument * 2) +
                    (double)value._4_4_ * 0.125);
      fVar6 = functionObject::getFunctionEnum(function_object);
      if (fVar6 == FUNCTION_ROUND) {
        GVar2 = Math::fract((GLdouble)argument_dst_1);
        if ((GVar2 == 0.5) && (!NAN(GVar2))) {
          argument_dst_1 = (GLint *)((double)argument_dst_1 + 0.01);
        }
      }
      *(GLint **)(buffer + (ulong)value._4_4_ * 8) = argument_dst_1;
    }
  }
  else if (_Var3 == VARIABLE_TYPE_INT) {
    for (argument_dst_2._4_4_ = 0; argument_dst_2._4_4_ < GVar5;
        argument_dst_2._4_4_ = argument_dst_2._4_4_ + 1) {
      *(uint *)(buffer + (ulong)argument_dst_2._4_4_ * 4) = argument_dst_2._4_4_ - 4;
    }
  }
  else {
    if (_Var3 != VARIABLE_TYPE_UINT) {
      pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar7,"Not implemented",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cGPUShaderFP64Tests.cpp"
                 ,0x39f7);
      __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    GVar1 = argument_reset[(ulong)argument + 2];
    for (local_d4 = 0; local_d4 < GVar5; local_d4 = local_d4 + 1) {
      *(GLuint *)(buffer + (ulong)local_d4 * 4) = GVar1 + local_d4;
    }
  }
  return;
}

Assistant:

void GPUShaderFP64Test10::prepareComponents(const functionObject& function_object, glw::GLuint vertex,
											glw::GLuint argument, glw::GLubyte* buffer)
{
	glw::GLuint					argument_index[3]		 = { 0 };
	glw::GLuint					argument_reset[3]		 = { 0 };
	glw::GLuint					argument_step[3]		 = { 0 };
	glw::GLdouble				double_argument_start[3] = { 0.0 };
	const Utils::_variable_type base_arg_type = Utils::getBaseVariableType(function_object.getArgumentType(argument));
	glw::GLuint					int_argument_start  = -4;
	const glw::GLuint			n_arguments			= function_object.getArgumentCount();
	const glw::GLuint			n_components		= function_object.getArgumentComponents(argument);
	glw::GLuint					uint_argument_start = 0;

	switch (n_arguments)
	{
	case 1:
		argument_step[0]		 = 1;
		argument_reset[0]		 = 1024;
		double_argument_start[0] = -511.5;
		break;
	case 2:
		argument_step[0]		 = 32;
		argument_step[1]		 = 1;
		argument_reset[0]		 = 32;
		argument_reset[1]		 = 32;
		double_argument_start[0] = -15.5;
		double_argument_start[1] = -15.5;
		break;
	case 3:
		argument_step[0]		 = 64;
		argument_step[1]		 = 8;
		argument_step[2]		 = 1;
		argument_reset[0]		 = 16;
		argument_reset[1]		 = 8;
		argument_reset[2]		 = 8;
		double_argument_start[0] = -7.5;
		double_argument_start[1] = -3.5;
		double_argument_start[2] = -3.5;
		break;
	default:
		TCU_FAIL("Not implemented");
		return;
		break;
	};

	switch (function_object.getFunctionEnum())
	{
	case FUNCTION_CLAMP: /* arg_2 must be less than arg_3 */
	case FUNCTION_CLAMP_AGAINST_SCALAR:
		double_argument_start[2] = 4.5;
		break;
	case FUNCTION_INVERSESQRT: /* inversesqrt is undefined for argument <= 0 */
		double_argument_start[0] = 16.5;
		break;
	case FUNCTION_SMOOTHSTEP: /* arg_1 must be less than arg_2 */
	case FUNCTION_SMOOTHSTEP_AGAINST_SCALAR:
		argument_step[0]		 = 1;
		argument_step[1]		 = 8;
		argument_step[2]		 = 64;
		argument_reset[0]		 = 8;
		argument_reset[1]		 = 8;
		argument_reset[2]		 = 16;
		double_argument_start[0] = -3.5;
		double_argument_start[1] = 4.5;
		double_argument_start[2] = -7.5;
		break;
	default:
		break;
	}

	for (glw::GLuint i = 0; i < n_arguments; ++i)
	{
		argument_index[i] = (vertex / argument_step[i]) % argument_reset[i];
	}

	switch (base_arg_type)
	{
	case Utils::VARIABLE_TYPE_DOUBLE:
	{
		glw::GLdouble* argument_dst = (glw::GLdouble*)buffer;

		double_argument_start[argument] += argument_index[argument];

		for (glw::GLuint component = 0; component < n_components; ++component)
		{
			glw::GLdouble value = double_argument_start[argument] + ((glw::GLdouble)component) / 8.0;

			switch (function_object.getFunctionEnum())
			{
			case FUNCTION_ROUND: /* Result for 0.5 depends on implementation */
				if (0.5 == Math::fract(value))
				{
					value += 0.01;
				}
				break;
			default:
				break;
			}

			argument_dst[component] = value;
		}
	}
	break;
	case Utils::VARIABLE_TYPE_INT:
	{
		glw::GLint* argument_dst = (glw::GLint*)buffer;

		uint_argument_start += argument_index[argument];

		for (glw::GLuint component = 0; component < n_components; ++component)
		{
			const glw::GLint value = int_argument_start + component;

			argument_dst[component] = value;
		}
	}
	break;
	case Utils::VARIABLE_TYPE_UINT:
	{
		glw::GLuint* argument_dst = (glw::GLuint*)buffer;

		uint_argument_start += argument_index[argument];

		for (glw::GLuint component = 0; component < n_components; ++component)
		{
			const glw::GLuint value = uint_argument_start + component;

			argument_dst[component] = value;
		}
	}
	break;
	default:
		TCU_FAIL("Not implemented");
		return;
		break;
	}
}